

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlibversion.h
# Opt level: O2

string * __thiscall trun::Version::AsString_abi_cxx11_(string *__return_storage_ptr__,Version *this)

{
  allocator<char> local_39;
  char buffer [32];
  
  snprintf(buffer,0x1f,"%d.%d.%d",(ulong)(this->data).ver.major,(ulong)(this->data).ver.minor,
           (ulong)(this->data).ver.patch);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,buffer,&local_39);
  return __return_storage_ptr__;
}

Assistant:

const std::string AsString() const {
            char buffer[32];
            snprintf(buffer,31,"%d.%d.%d", data.ver.major, data.ver.minor, data.ver.patch);
            return std::string(buffer);
        }